

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SStream.c
# Opt level: O0

void SStream_concat0(SStream *ss,char *s)

{
  size_t sVar1;
  uint len;
  char *s_local;
  SStream *ss_local;
  
  sVar1 = strlen(s);
  memcpy(ss->buffer + ss->index,s,sVar1 & 0xffffffff);
  ss->index = (int)sVar1 + ss->index;
  ss->buffer[ss->index] = '\0';
  return;
}

Assistant:

void SStream_concat0(SStream *ss, char *s)
{
#ifndef CAPSTONE_DIET
	unsigned int len = (unsigned int) strlen(s);

	memcpy(ss->buffer + ss->index, s, len);
	ss->index += len;
	ss->buffer[ss->index] = '\0';
#endif
}